

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

bool __thiscall QGraphicsItem::isObscured(QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScene *this_00;
  QGraphicsItem **ppQVar2;
  bool bVar3;
  long lVar4;
  qreal *pqVar5;
  QTransform *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  byte bVar8;
  QArrayDataPointer<QPointF> local_100;
  QArrayDataPointer<QGraphicsItem_*> local_e8;
  QRectF local_c8;
  QRectF local_a8;
  QTransform local_88;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  if (pQVar1->scene == (QGraphicsScene *)0x0) {
    bVar3 = false;
  }
  else {
    local_a8.w._0_4_ = 0xffffffff;
    local_a8.w._4_4_ = 0xffffffff;
    local_a8.h._0_4_ = 0xffffffff;
    local_a8.h._4_4_ = 0xffffffff;
    local_a8.xp._0_4_ = 0xffffffff;
    local_a8.xp._4_4_ = 0xffffffff;
    local_a8.yp._0_4_ = 0xffffffff;
    local_a8.yp._4_4_ = 0xffffffff;
    (*this->_vptr_QGraphicsItem[3])(&local_a8,this);
    if (rect->h == 0.0 && rect->w == 0.0) {
      rect = &local_a8;
    }
    local_c8.xp = rect->xp;
    local_c8.yp = rect->yp;
    local_c8.w = rect->w;
    local_c8.h = rect->h;
    local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QGraphicsScene *)pQVar1->scene;
    mapToScene((QPolygonF *)&local_100,this,&local_a8);
    pqVar5 = (qreal *)&DAT_006777b8;
    pQVar6 = &local_88;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      pQVar6->m_matrix[0][0] = *pqVar5;
      pqVar5 = pqVar5 + (ulong)bVar8 * -2 + 1;
      pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    local_88._72_2_ = 0;
    QGraphicsScene::items
              ((QList<QGraphicsItem_*> *)&local_e8,this_00,(QPolygonF *)&local_100,
               IntersectsItemBoundingRect,DescendingOrder,&local_88);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_100);
    ppQVar2 = local_e8.ptr;
    lVar4 = local_e8.size << 3;
    lVar7 = 0;
    do {
      if ((lVar4 == lVar7) || (*(QGraphicsItem **)((long)ppQVar2 + lVar7) == this)) {
        bVar3 = false;
        goto LAB_00577f0a;
      }
      bVar3 = qt_QGraphicsItem_isObscured(this,*(QGraphicsItem **)((long)ppQVar2 + lVar7),&local_c8)
      ;
      lVar7 = lVar7 + 8;
    } while (!bVar3);
    bVar3 = true;
LAB_00577f0a:
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsItem::isObscured(const QRectF &rect) const
{
    Q_D(const QGraphicsItem);
    if (!d->scene)
        return false;

    QRectF br = boundingRect();
    QRectF testRect = rect.isNull() ? br : rect;

    const auto items = d->scene->items(mapToScene(br), Qt::IntersectsItemBoundingRect);
    for (QGraphicsItem *item : items) {
        if (item == this)
            break;
        if (qt_QGraphicsItem_isObscured(this, item, testRect))
            return true;
    }
    return false;
}